

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3AtoF(char *z,double *pResult,int length,u8 enc)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  byte *pbVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  byte *pbVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  longdouble lVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined4 uVar24;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double rr [2];
  double local_68;
  double local_60;
  int local_4c;
  double *local_48;
  
  *pResult = 0.0;
  if (length != 0) {
    if (enc == '\x01') {
      iVar9 = 1;
      lVar7 = 1;
      pbVar10 = (byte *)z;
    }
    else {
      uVar12 = 3 - enc;
      uVar4 = (ulong)uVar12;
      iVar9 = 1;
      if ((int)uVar12 < (int)(length & 0xfffffffeU)) {
        uVar4 = (ulong)(int)(3 - (uint)enc);
        do {
          if (z[uVar4] != '\0') {
            iVar9 = -100;
            goto LAB_0013a235;
          }
          uVar4 = uVar4 + 2;
        } while ((long)uVar4 < (long)(int)(length & 0xfffffffeU));
        iVar9 = 1;
      }
LAB_0013a235:
      length = (uint)uVar4 ^ 1;
      pbVar10 = (byte *)(z + (enc & 1));
      lVar7 = 2;
    }
    pbVar6 = (byte *)(z + length);
    for (; pbVar10 < pbVar6; pbVar10 = pbVar10 + lVar7) {
      bVar1 = *pbVar10;
      if ((""[bVar1] & 1) == 0) {
        iVar11 = 0;
        lVar3 = 0;
        if ((bVar1 - 0x2b & 0xfd) == 0) {
          lVar3 = lVar7;
        }
        pbVar10 = pbVar10 + lVar3;
        local_4c = 1;
        if (pbVar6 <= pbVar10) goto LAB_0013a3ea;
        iVar11 = 0;
        iVar5 = 0;
        uVar4 = 0;
        goto LAB_0013a2a9;
      }
    }
  }
  return 0;
LAB_0013a2a9:
  bVar2 = *pbVar10;
  if (0xfffffffffffffff5 < (ulong)bVar2 - 0x3a) {
    uVar4 = ((long)(char)bVar2 + uVar4 * 10) - 0x30;
    pbVar10 = pbVar10 + lVar7;
    if (0x1999999999999997 < uVar4) {
      for (; (pbVar10 < pbVar6 && (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a));
          pbVar10 = pbVar10 + lVar7) {
        iVar5 = iVar5 + 1;
      }
    }
    iVar11 = iVar11 + 1;
    if (pbVar6 <= pbVar10) goto LAB_0013a395;
    goto LAB_0013a2a9;
  }
  if (bVar2 == 0x2e) {
    iVar9 = iVar9 + 1;
    while ((pbVar10 = pbVar10 + lVar7, pbVar10 < pbVar6 &&
           (0xfffffffffffffff5 < (ulong)*pbVar10 - 0x3a))) {
      if (uVar4 < 0x1999999999999998) {
        uVar4 = ((long)(char)*pbVar10 + uVar4 * 10) - 0x30;
        iVar5 = iVar5 + -1;
        iVar11 = iVar11 + 1;
      }
    }
  }
  if (pbVar10 < pbVar6) {
    if ((*pbVar10 | 0x20) == 0x65) {
      pbVar10 = pbVar10 + lVar7;
      iVar9 = iVar9 + 1;
      if (pbVar6 <= pbVar10) {
        iVar16 = 0;
        iVar14 = 1;
        local_4c = 0;
        goto LAB_0013a3a4;
      }
      iVar14 = 1;
      if (*pbVar10 == 0x2b) {
        pbVar10 = pbVar10 + lVar7;
      }
      else if (*pbVar10 == 0x2d) {
        pbVar10 = pbVar10 + lVar7;
        iVar14 = -1;
      }
      iVar16 = 0;
      if ((pbVar10 < pbVar6) && (uVar8 = (ulong)*pbVar10, 0xfffffffffffffff5 < uVar8 - 0x3a)) {
        iVar15 = 0;
        do {
          pbVar10 = pbVar10 + lVar7;
          iVar16 = (char)uVar8 + -0x30 + iVar15 * 10;
          if (9999 < iVar15) {
            iVar16 = 10000;
          }
          local_4c = 1;
          if (pbVar6 <= pbVar10) goto LAB_0013a910;
          uVar8 = (ulong)*pbVar10;
          iVar15 = iVar16;
        } while (0xfffffffffffffff5 < uVar8 - 0x3a);
        local_4c = 1;
      }
      else {
        local_4c = 0;
      }
    }
    else {
      iVar16 = 0;
      iVar14 = 1;
      local_4c = 1;
    }
LAB_0013a910:
    while ((pbVar10 < pbVar6 && ((""[*pbVar10] & 1) != 0))) {
      pbVar10 = pbVar10 + lVar7;
    }
  }
  else {
LAB_0013a395:
    iVar16 = 0;
    iVar14 = 1;
    local_4c = 1;
  }
LAB_0013a3a4:
  if (uVar4 == 0) {
LAB_0013a3ea:
    if (bVar1 == 0x2d) {
      local_68 = -0.0;
    }
    else {
      local_68 = 0.0;
    }
  }
  else {
    uVar12 = iVar16 * iVar14 + iVar5;
    if ((uVar12 == 0 || SCARRY4(iVar16 * iVar14,iVar5) != (int)uVar12 < 0) ||
       (0x1999999999999998 < uVar4)) {
      uVar8 = uVar4;
      uVar13 = uVar12;
      if (((int)uVar12 < 0) && (uVar4 == (uVar4 / 5 & 0xfffffffffffffffe) * 5)) {
        iVar5 = -uVar12;
        do {
          uVar4 = uVar4 / 10;
          iVar14 = iVar5 + -1;
          if (iVar5 == 1) break;
          iVar5 = iVar14;
        } while (uVar4 == (uVar4 / 10) * 10);
        uVar8 = uVar4;
        uVar13 = -iVar14;
      }
    }
    else {
      do {
        uVar8 = uVar4 * 10;
        uVar13 = uVar12 - 1;
        if (uVar12 < 2) break;
        bVar17 = uVar4 < 0x28f5c28f5c28f5d;
        uVar4 = uVar8;
        uVar12 = uVar13;
      } while (bVar17);
    }
    uVar24 = (undefined4)(uVar8 >> 0x20);
    if (uVar13 == 0) {
      auVar21._8_4_ = uVar24;
      auVar21._0_8_ = uVar8;
      auVar21._12_4_ = 0x45300000;
      local_68 = (auVar21._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
    }
    else if (sqlite3Config.bUseLongDouble == '\0') {
      auVar19._8_4_ = uVar24;
      auVar19._0_8_ = uVar8;
      auVar19._12_4_ = 0x45300000;
      local_68 = (auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0);
      uVar4 = (long)(local_68 - 9.223372036854776e+18) & (long)local_68 >> 0x3f | (long)local_68;
      lVar7 = uVar8 - uVar4;
      if (uVar8 < uVar4) {
        lVar7 = uVar4 - uVar8;
        auVar22._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar22._0_8_ = lVar7;
        auVar22._12_4_ = 0x45300000;
        local_60 = -((auVar22._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
      }
      else {
        auVar23._8_4_ = (int)((ulong)lVar7 >> 0x20);
        auVar23._0_8_ = lVar7;
        auVar23._12_4_ = 0x45300000;
        local_60 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0);
      }
      local_48 = pResult;
      if ((int)uVar13 < 1) {
        uVar12 = uVar13;
        if (uVar13 < 0xffffff9d) {
          do {
            uVar13 = uVar12 + 100;
            dekkerMul2(&local_68,1e-100,-1.9991899802602883e-117);
            bVar17 = uVar12 < 0xffffff39;
            uVar12 = uVar13;
          } while (bVar17);
        }
        uVar12 = uVar13;
        if ((int)uVar13 < -9) {
          do {
            uVar13 = uVar12 + 10;
            dekkerMul2(&local_68,1e-10,-3.643219731549774e-27);
            bVar17 = uVar12 < 0xffffffed;
            uVar12 = uVar13;
          } while (bVar17);
        }
        if ((int)uVar13 < 0) {
          do {
            dekkerMul2(&local_68,0.1,-5.551115123125783e-18);
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0);
        }
      }
      else {
        for (; 99 < uVar13; uVar13 = uVar13 - 100) {
          dekkerMul2(&local_68,1e+100,-1.5902891109759918e+83);
        }
        if (9 < uVar13) {
          do {
            uVar13 = uVar13 - 10;
            dekkerMul2(&local_68,10000000000.0,0.0);
          } while (9 < uVar13);
        }
        if (uVar13 != 0) {
          uVar13 = uVar13 + 1;
          do {
            dekkerMul2(&local_68,10.0,0.0);
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      local_68 = local_68 + local_60;
      dVar20 = local_68;
      if (((ulong)local_68 & 0xfffffffffffff) != 0) {
        dVar20 = INFINITY;
      }
      pResult = local_48;
      if ((~(ulong)local_68 & 0x7ff0000000000000) == 0) {
        local_68 = dVar20;
      }
    }
    else {
      lVar18 = (longdouble)(long)uVar8 +
               (longdouble)*(float *)(&DAT_001c0768 + (ulong)((long)uVar8 < 0) * 4);
      if ((int)uVar13 < 1) {
        uVar12 = uVar13;
        if (uVar13 < 0xffffff9d) {
          do {
            lVar18 = lVar18 * _DAT_001c0470;
            uVar12 = uVar13 + 100;
            bVar17 = uVar13 < 0xffffff39;
            uVar13 = uVar12;
          } while (bVar17);
        }
        uVar13 = uVar12;
        if ((int)uVar12 < -9) {
          do {
            lVar18 = lVar18 * _DAT_001c0490;
            uVar13 = uVar12 + 10;
            bVar17 = uVar12 < 0xffffffed;
            uVar12 = uVar13;
          } while (bVar17);
        }
        if ((int)uVar13 < 0) {
          do {
            lVar18 = lVar18 * _DAT_001c04a0;
            uVar13 = uVar13 + 1;
          } while (uVar13 != 0);
        }
      }
      else {
        for (; 99 < uVar13; uVar13 = uVar13 - 100) {
          lVar18 = lVar18 * _DAT_001c04c0;
        }
        for (; 9 < uVar13; uVar13 = uVar13 - 10) {
          lVar18 = lVar18 * (longdouble)1e+10;
        }
        if (uVar13 != 0) {
          uVar13 = uVar13 + 1;
          do {
            lVar18 = lVar18 * (longdouble)10.0;
            uVar13 = uVar13 - 1;
          } while (1 < uVar13);
        }
      }
      local_68 = (double)lVar18;
      if ((longdouble)1.79769313486232e+308 < lVar18) {
        local_68 = INFINITY;
      }
    }
    *pResult = local_68;
    if (bVar1 != 0x2d) goto LAB_0013a84c;
    local_68 = -local_68;
  }
  *pResult = local_68;
LAB_0013a84c:
  if ((((local_4c != 0) && (pbVar10 == pbVar6)) && (0 < iVar11)) && (0 < iVar9)) {
    return iVar9;
  }
  if (((1 < iVar9) && (local_4c != 0 || iVar9 == 3)) && (0 < iVar11)) {
    return -1;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3AtoF(const char *z, double *pResult, int length, u8 enc){
#ifndef SQLITE_OMIT_FLOATING_POINT
  int incr;
  const char *zEnd;
  /* sign * significand * (10 ^ (esign * exponent)) */
  int sign = 1;    /* sign of significand */
  u64 s = 0;       /* significand */
  int d = 0;       /* adjust exponent for shifting decimal point */
  int esign = 1;   /* sign of exponent */
  int e = 0;       /* exponent */
  int eValid = 1;  /* True exponent is either not used or is well-formed */
  int nDigit = 0;  /* Number of digits processed */
  int eType = 1;   /* 1: pure integer,  2+: fractional  -1 or less: bad UTF16 */

  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  *pResult = 0.0;   /* Default return value, in case of an error */
  if( length==0 ) return 0;

  if( enc==SQLITE_UTF8 ){
    incr = 1;
    zEnd = z + length;
  }else{
    int i;
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    testcase( enc==SQLITE_UTF16LE );
    testcase( enc==SQLITE_UTF16BE );
    for(i=3-enc; i<length && z[i]==0; i+=2){}
    if( i<length ) eType = -100;
    zEnd = &z[i^1];
    z += (enc&1);
  }

  /* skip leading spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;
  if( z>=zEnd ) return 0;

  /* get sign of significand */
  if( *z=='-' ){
    sign = -1;
    z+=incr;
  }else if( *z=='+' ){
    z+=incr;
  }

  /* copy max significant digits to significand */
  while( z<zEnd && sqlite3Isdigit(*z) ){
    s = s*10 + (*z - '0');
    z+=incr; nDigit++;
    if( s>=((LARGEST_UINT64-9)/10) ){
      /* skip non-significant significand digits
      ** (increase exponent by d to shift decimal left) */
      while( z<zEnd && sqlite3Isdigit(*z) ){ z+=incr; d++; }
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if decimal point is present */
  if( *z=='.' ){
    z+=incr;
    eType++;
    /* copy digits from after decimal to significand
    ** (decrease exponent by d to shift decimal right) */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      if( s<((LARGEST_UINT64-9)/10) ){
        s = s*10 + (*z - '0');
        d--;
        nDigit++;
      }
      z+=incr;
    }
  }
  if( z>=zEnd ) goto do_atof_calc;

  /* if exponent is present */
  if( *z=='e' || *z=='E' ){
    z+=incr;
    eValid = 0;
    eType++;

    /* This branch is needed to avoid a (harmless) buffer overread.  The
    ** special comment alerts the mutation tester that the correct answer
    ** is obtained even if the branch is omitted */
    if( z>=zEnd ) goto do_atof_calc;              /*PREVENTS-HARMLESS-OVERREAD*/

    /* get sign of exponent */
    if( *z=='-' ){
      esign = -1;
      z+=incr;
    }else if( *z=='+' ){
      z+=incr;
    }
    /* copy digits to exponent */
    while( z<zEnd && sqlite3Isdigit(*z) ){
      e = e<10000 ? (e*10 + (*z - '0')) : 10000;
      z+=incr;
      eValid = 1;
    }
  }

  /* skip trailing spaces */
  while( z<zEnd && sqlite3Isspace(*z) ) z+=incr;

do_atof_calc:
  /* Zero is a special case */
  if( s==0 ){
    *pResult = sign<0 ? -0.0 : +0.0;
    goto atof_return;
  }

  /* adjust exponent by d, and update sign */
  e = (e*esign) + d;

  /* Try to adjust the exponent to make it smaller */
  while( e>0 && s<(LARGEST_UINT64/10) ){
    s *= 10;
    e--;
  }
  while( e<0 && (s%10)==0 ){
    s /= 10;
    e++;
  }

  if( e==0 ){
    *pResult = s;
  }else if( sqlite3Config.bUseLongDouble ){
    LONGDOUBLE_TYPE r = (LONGDOUBLE_TYPE)s;
    if( e>0 ){
      while( e>=100  ){ e-=100; r *= 1.0e+100L; }
      while( e>=10   ){ e-=10;  r *= 1.0e+10L;  }
      while( e>=1    ){ e-=1;   r *= 1.0e+01L;  }
    }else{
      while( e<=-100 ){ e+=100; r *= 1.0e-100L; }
      while( e<=-10  ){ e+=10;  r *= 1.0e-10L;  }
      while( e<=-1   ){ e+=1;   r *= 1.0e-01L;  }
    }
    assert( r>=0.0 );
    if( r>+1.7976931348623157081452742373e+308L ){
#ifdef INFINITY
      *pResult = +INFINITY;
#else
      *pResult = 1.0e308*10.0;
#endif
    }else{
      *pResult = (double)r;
    }
  }else{
    double rr[2];
    u64 s2;
    rr[0] = (double)s;
    s2 = (u64)rr[0];
#if defined(_MSC_VER) && _MSC_VER<1700
    if( s2==0x8000000000000000LL ){ s2 = 2*(u64)(0.5*rr[0]); }
#endif
    rr[1] = s>=s2 ? (double)(s - s2) : -(double)(s2 - s);
    if( e>0 ){
      while( e>=100  ){
        e -= 100;
        dekkerMul2(rr, 1.0e+100, -1.5902891109759918046e+83);
      }
      while( e>=10   ){
        e -= 10;
        dekkerMul2(rr, 1.0e+10, 0.0);
      }
      while( e>=1    ){
        e -= 1;
        dekkerMul2(rr, 1.0e+01, 0.0);
      }
    }else{
      while( e<=-100 ){
        e += 100;
        dekkerMul2(rr, 1.0e-100, -1.99918998026028836196e-117);
      }
      while( e<=-10  ){
        e += 10;
        dekkerMul2(rr, 1.0e-10, -3.6432197315497741579e-27);
      }
      while( e<=-1   ){
        e += 1;
        dekkerMul2(rr, 1.0e-01, -5.5511151231257827021e-18);
      }
    }
    *pResult = rr[0]+rr[1];
    if( sqlite3IsNaN(*pResult) ) *pResult = 1e300*1e300;
  }
  if( sign<0 ) *pResult = -*pResult;
  assert( !sqlite3IsNaN(*pResult) );

atof_return:
  /* return true if number and no extra non-whitespace characters after */
  if( z==zEnd && nDigit>0 && eValid && eType>0 ){
    return eType;
  }else if( eType>=2 && (eType==3 || eValid) && nDigit>0 ){
    return -1;
  }else{
    return 0;
  }
#else
  return !sqlite3Atoi64(z, pResult, length, enc);
#endif /* SQLITE_OMIT_FLOATING_POINT */
}